

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::PathTypeHandlerBase::TryUseFixedAccessor
          (PathTypeHandlerBase *this,PropertyRecord *propertyRecord,Var *pAccessor,
          FixedPropertyKind propertyType,bool getter,ScriptContext *requestContext)

{
  bool bVar1;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015cd718,FixedMethodsPhase);
  if ((((!bVar1) || (DAT_015d346a == '\0')) &&
      ((bVar1 = Phases::IsEnabled((Phases *)&DAT_015d3490,FixedMethodsPhase), !bVar1 ||
       (DAT_015d346a == '\0')))) &&
     ((bVar1 = Phases::IsEnabled((Phases *)&DAT_015cd718,UseFixedDataPropsPhase), !bVar1 ||
      (DAT_015d346a == '\0')))) {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_015d3490,UseFixedDataPropsPhase);
    if (!bVar1) {
      return false;
    }
    if (DAT_015d346a != '\x01') {
      return false;
    }
  }
  Output::Print(L"FixedFields: attempt to use fixed accessor %s from PathTypeHandler returned false.\n"
                ,propertyRecord + 1);
  bVar1 = HasSingletonInstance(this);
  if ((bVar1) &&
     (HasSingletonInstance(this),
     *(ScriptContext **)
      (*(long *)(*(long *)((((((this->typePath).ptr)->singletonInstance).ptr)->
                           super_RecyclerWeakReferenceBase).strongRef + 8) + 8) + 0x490) !=
     requestContext)) {
    Output::Print(L"FixedFields: Cross Site Script Context is used for property %s. \n",
                  propertyRecord + 1);
  }
  Output::Flush();
  return false;
}

Assistant:

bool PathTypeHandlerBase::TryUseFixedAccessor(PropertyRecord const * propertyRecord, Var * pAccessor, FixedPropertyKind propertyType, bool getter, ScriptContext * requestContext)
    {
        if (PHASE_VERBOSE_TRACE1(Js::FixedMethodsPhase) || PHASE_VERBOSE_TESTTRACE1(Js::FixedMethodsPhase) ||
            PHASE_VERBOSE_TRACE1(Js::UseFixedDataPropsPhase) || PHASE_VERBOSE_TESTTRACE1(Js::UseFixedDataPropsPhase))
        {
            Output::Print(_u("FixedFields: attempt to use fixed accessor %s from PathTypeHandler returned false.\n"), propertyRecord->GetBuffer());
            if (this->HasSingletonInstance() && this->GetSingletonInstance()->Get()->GetScriptContext() != requestContext)
            {
                Output::Print(_u("FixedFields: Cross Site Script Context is used for property %s. \n"), propertyRecord->GetBuffer());
            }
            Output::Flush();
        }
        return false;
    }